

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O3

TVariable * __thiscall
glslang::HlslParseContext::makeInternalVariable(HlslParseContext *this,char *name,TType *type)

{
  TSymbolTable *pTVar1;
  TPoolAllocator *pTVar2;
  TString *name_00;
  TVariable *this_00;
  pool_allocator<char> local_28;
  
  pTVar2 = GetThreadPoolAllocator();
  name_00 = (TString *)TPoolAllocator::allocate(pTVar2,0x28);
  local_28.allocator = GetThreadPoolAllocator();
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)name_00,name
             ,&local_28);
  pTVar2 = GetThreadPoolAllocator();
  this_00 = (TVariable *)TPoolAllocator::allocate(pTVar2,0xf8);
  TVariable::TVariable(this_00,name_00,name_00,type,false);
  pTVar1 = (this->super_TParseContextBase).symbolTable;
  pTVar1->uniqueId = pTVar1->uniqueId + 1;
  (*(this_00->super_TSymbol)._vptr_TSymbol[0xe])(this_00);
  return this_00;
}

Assistant:

TVariable* HlslParseContext::makeInternalVariable(const char* name, const TType& type) const
{
    TString* nameString = NewPoolTString(name);
    TVariable* variable = new TVariable(nameString, type);
    symbolTable.makeInternalVariable(*variable);

    return variable;
}